

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::AddCleanFile(cmQtAutoGenInitializer *this,string *fileName)

{
  cmTarget *this_00;
  char *value;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *fileName_local;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = this->Target->Target;
  local_18 = fileName;
  fileName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_CLEAN_FILES",&local_39);
  value = (char *)std::__cxx11::string::c_str();
  cmTarget::AppendProperty(this_00,&local_38,value,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCleanFile(std::string const& fileName)
{
  Target->Target->AppendProperty("ADDITIONAL_CLEAN_FILES", fileName.c_str(),
                                 false);
}